

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesMainForm.cxx
# Opt level: O0

void __thiscall cmCursesMainForm::UpdateStatusBar(cmCursesMainForm *this,char *message)

{
  int iVar1;
  FIELD *field;
  cmState *pcVar2;
  char *pcVar3;
  size_t sVar4;
  size_t sVar5;
  int local_684;
  int local_674;
  int local_668;
  int local_664;
  undefined2 local_653;
  undefined1 local_651;
  ulong uStack_650;
  char fmt_s [3];
  size_t sideSpace;
  char vertmp [128];
  char version [512];
  size_t width;
  size_t helpLen;
  size_t curFieldLen;
  size_t i;
  char bar [512];
  string local_1a0;
  allocator local_179;
  string local_178;
  char *local_158;
  char *hs;
  allocator local_139;
  string local_138;
  char *local_118;
  char *existingValue;
  char *curField;
  char help [128];
  long *local_80;
  cmCursesWidget *lbl;
  int findex;
  FIELD *cur;
  char fmt [59];
  int y;
  int x;
  char *message_local;
  cmCursesMainForm *this_local;
  
  if (_stdscr == 0) {
    local_664 = -1;
    local_668 = -1;
  }
  else {
    local_664 = *(short *)(_stdscr + 4) + 1;
    local_668 = *(short *)(_stdscr + 6) + 1;
  }
  if (((local_668 < 0x41) || (local_668 < this->InitialWidth)) || (local_664 < 6)) {
    curses_clear();
    curses_move(0,0);
    memcpy(&cur,"Window is too small. A size of at least %dx%d is required.",0x3b);
    if (this->InitialWidth < 0x42) {
      local_674 = 0x41;
    }
    else {
      local_674 = this->InitialWidth;
    }
    printw(&cur,local_674,6);
    if (_stdscr == 0) {
      local_684 = -1;
    }
    else {
      local_684 = *(short *)(_stdscr + 4) + 1;
    }
    wtouchln(_stdscr,0,local_684,1);
    wrefresh(_stdscr);
  }
  else {
    field = current_field((this->super_cmCursesForm).Form);
    iVar1 = field_index(field);
    local_80 = (long *)0x0;
    if (-1 < iVar1) {
      local_80 = (long *)field_userptr(this->Fields[iVar1 + -2]);
    }
    memset(&curField,0,0x80);
    existingValue = "";
    if (local_80 != (long *)0x0) {
      existingValue = (char *)(**(code **)(*local_80 + 0x28))();
      pcVar2 = cmake::GetState(this->CMakeInstance);
      pcVar3 = existingValue;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_138,pcVar3,&local_139);
      pcVar3 = cmState::GetCacheEntryValue(pcVar2,&local_138);
      std::__cxx11::string::~string((string *)&local_138);
      std::allocator<char>::~allocator((allocator<char> *)&local_139);
      local_118 = pcVar3;
      if (pcVar3 == (char *)0x0) {
        sprintf((char *)&curField," ");
      }
      else {
        pcVar2 = cmake::GetState(this->CMakeInstance);
        pcVar3 = existingValue;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_178,pcVar3,&local_179);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_1a0,"HELPSTRING",(allocator *)(bar + 0x1ff));
        pcVar3 = cmState::GetCacheEntryProperty(pcVar2,&local_178,&local_1a0);
        std::__cxx11::string::~string((string *)&local_1a0);
        std::allocator<char>::~allocator((allocator<char> *)(bar + 0x1ff));
        std::__cxx11::string::~string((string *)&local_178);
        std::allocator<char>::~allocator((allocator<char> *)&local_179);
        local_158 = pcVar3;
        if (pcVar3 == (char *)0x0) {
          curField._0_1_ = 0;
        }
        else {
          strncpy((char *)&curField,pcVar3,0x7f);
          help[0x77] = '\0';
        }
      }
    }
    sVar4 = strlen(existingValue);
    sVar5 = strlen((char *)&curField);
    if (local_668 < 0x200) {
      version._504_8_ = SEXT48(local_668);
    }
    else {
      version[0x1f8] = '\0';
      version[0x1f9] = '\x02';
      version[0x1fa] = '\0';
      version[0x1fb] = '\0';
      version[0x1fc] = '\0';
      version[0x1fd] = '\0';
      version[0x1fe] = '\0';
      version[0x1ff] = '\0';
    }
    if (message == (char *)0x0) {
      if (sVar4 < (ulong)version._504_8_) {
        strcpy((char *)&i,existingValue);
        bar[sVar4 - 8] = ':';
        bar[sVar4 - 7] = ' ';
        if (sVar4 + sVar5 + 2 < (ulong)version._504_8_) {
          strcpy(bar + (sVar4 - 6),(char *)&curField);
          for (curFieldLen = sVar4 + sVar5 + 2; curFieldLen < (ulong)version._504_8_;
              curFieldLen = curFieldLen + 1) {
            bar[curFieldLen - 8] = ' ';
          }
        }
        else {
          strncpy(bar + (sVar4 - 6),(char *)&curField,(version._504_8_ - sVar4) - 2);
        }
      }
      else {
        strncpy((char *)&i,existingValue,version._504_8_);
      }
    }
    else {
      existingValue = message;
      curFieldLen = strlen(message);
      if (curFieldLen < (ulong)version._504_8_) {
        strcpy((char *)&i,existingValue);
        for (; curFieldLen < (ulong)version._504_8_; curFieldLen = curFieldLen + 1) {
          bar[curFieldLen - 8] = ' ';
        }
      }
      else {
        strncpy((char *)&i,existingValue,version._504_8_);
      }
    }
    bar[version._504_8_ + -8] = '\0';
    pcVar3 = cmVersion::GetCMakeVersion();
    sprintf((char *)&sideSpace,"CMake Version %s",pcVar3);
    sVar4 = strlen((char *)&sideSpace);
    uStack_650 = version._504_8_ - sVar4;
    for (curFieldLen = 0; curFieldLen < uStack_650; curFieldLen = curFieldLen + 1) {
      vertmp[curFieldLen + 0x78] = ' ';
    }
    sprintf(vertmp + uStack_650 + 0x78,"%s",&sideSpace);
    vertmp[version._504_8_ + 0x78] = '\0';
    local_653 = 0x7325;
    local_651 = 0;
    curses_move(local_664 - 5,0);
    wattr_on(_stdscr,0x10000,0);
    printw(&local_653,&i);
    wattr_off(_stdscr,0x10000,0);
    curses_move(local_664 - 4,0);
    printw(&local_653,vertmp + 0x78);
    pos_form_cursor((this->super_cmCursesForm).Form);
  }
  return;
}

Assistant:

void cmCursesMainForm::UpdateStatusBar(const char* message)
{
  int x,y;
  getmaxyx(stdscr, y, x);
  // If window size is too small, display error and return
  if ( x < cmCursesMainForm::MIN_WIDTH  ||
       x < this->InitialWidth               ||
       y < cmCursesMainForm::MIN_HEIGHT )
    {
    curses_clear();
    curses_move(0,0);
    char fmt[] = "Window is too small. A size of at least %dx%d is required.";
    printw(fmt,
           (cmCursesMainForm::MIN_WIDTH < this->InitialWidth ?
            this->InitialWidth : cmCursesMainForm::MIN_WIDTH),
           cmCursesMainForm::MIN_HEIGHT);
    touchwin(stdscr);
    wrefresh(stdscr);
    return;
    }

  // Get the key of the current entry
  FIELD* cur = current_field(this->Form);
  int findex = field_index(cur);
  cmCursesWidget* lbl = 0;
  if ( findex >= 0 )
    {
    lbl = reinterpret_cast<cmCursesWidget*>(field_userptr(this->Fields[findex-2]));
    }
  char help[128] = "";
  const char* curField = "";
  if ( lbl )
    {
    curField = lbl->GetValue();

    // Get the help string of the current entry
    // and add it to the help string
    const char* existingValue =
        this->CMakeInstance->GetState()->GetCacheEntryValue(curField);
    if (existingValue)
      {
      const char* hs = this->CMakeInstance->GetState()
                           ->GetCacheEntryProperty(curField, "HELPSTRING");
      if ( hs )
        {
        strncpy(help, hs, 127);
        help[127] = '\0';
        }
      else
        {
        help[0] = 0;
        }
      }
    else
      {
      sprintf(help," ");
      }
    }

  // Join the key, help string and pad with spaces
  // (or truncate) as necessary
  char bar[cmCursesMainForm::MAX_WIDTH];
  size_t i, curFieldLen = strlen(curField);
  size_t helpLen = strlen(help);

  size_t width;
  if (x < cmCursesMainForm::MAX_WIDTH )
    {
    width = x;
    }
  else
    {
    width = cmCursesMainForm::MAX_WIDTH;
    }

  if ( message )
    {
    curField = message;
    curFieldLen = strlen(message);
    if ( curFieldLen < width )
      {
      strcpy(bar, curField);
      for(i=curFieldLen; i < width; ++i)
        {
        bar[i] = ' ';
        }
      }
    else
      {
      strncpy(bar, curField, width);
      }
   }
  else
    {
    if (curFieldLen >= width)
      {
      strncpy(bar, curField, width);
      }
    else
      {
      strcpy(bar, curField);
      bar[curFieldLen] = ':';
      bar[curFieldLen+1] = ' ';
      if (curFieldLen + helpLen + 2 >= width)
        {
        strncpy(bar+curFieldLen+2, help, width
                - curFieldLen - 2);
        }
      else
        {
        strcpy(bar+curFieldLen+2, help);
        for(i=curFieldLen+helpLen+2; i < width; ++i)
          {
          bar[i] = ' ';
          }
        }
      }
    }


  bar[width] = '\0';


  // Display CMake version info on the next line
  // We want to display this on the right
  char version[cmCursesMainForm::MAX_WIDTH];
  char vertmp[128];
  sprintf(vertmp,"CMake Version %s", cmVersion::GetCMakeVersion());
  size_t sideSpace = (width-strlen(vertmp));
  for(i=0; i<sideSpace; i++) { version[i] = ' '; }
  sprintf(version+sideSpace, "%s", vertmp);
  version[width] = '\0';

  // Now print both lines
  char fmt_s[] = "%s";
  curses_move(y-5,0);
  attron(A_STANDOUT);
  printw(fmt_s, bar);
  attroff(A_STANDOUT);
  curses_move(y-4,0);
  printw(fmt_s, version);
  pos_form_cursor(this->Form);
}